

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_thread.c
# Opt level: O0

void * thread_loop(void *ptr)

{
  pthread_t __target_thread;
  long *in_RDI;
  char thread_name [16];
  AVxWorker *worker;
  char acStack_28 [15];
  undefined1 local_19;
  long *local_10;
  
  local_10 = in_RDI;
  if (in_RDI[2] != 0) {
    strncpy(acStack_28,(char *)in_RDI[2],0xf);
    local_19 = 0;
    __target_thread = pthread_self();
    pthread_setname_np(__target_thread,acStack_28);
  }
  pthread_mutex_lock((pthread_mutex_t *)*local_10);
  while( true ) {
    while ((int)local_10[1] == 1) {
      pthread_cond_wait((pthread_cond_t *)(*local_10 + 0x28),(pthread_mutex_t *)*local_10);
    }
    if ((int)local_10[1] != 2) break;
    pthread_mutex_unlock((pthread_mutex_t *)*local_10);
    execute((AVxWorker *)0x69bac1);
    pthread_mutex_lock((pthread_mutex_t *)*local_10);
    *(undefined4 *)(local_10 + 1) = 1;
    pthread_cond_signal((pthread_cond_t *)(*local_10 + 0x28));
  }
  pthread_mutex_unlock((pthread_mutex_t *)*local_10);
  return (void *)0x0;
}

Assistant:

static THREADFN thread_loop(void *ptr) {
  AVxWorker *const worker = (AVxWorker *)ptr;
#ifdef __APPLE__
  if (worker->thread_name != NULL) {
    // Apple's version of pthread_setname_np takes one argument and operates on
    // the current thread only. The maximum size of the thread_name buffer was
    // noted in the Chromium source code and was confirmed by experiments. If
    // thread_name is too long, pthread_setname_np returns -1 with errno
    // ENAMETOOLONG (63).
    char thread_name[64];
    strncpy(thread_name, worker->thread_name, sizeof(thread_name) - 1);
    thread_name[sizeof(thread_name) - 1] = '\0';
    pthread_setname_np(thread_name);
  }
#elif (defined(__GLIBC__) && !defined(__GNU__)) || defined(__BIONIC__)
  if (worker->thread_name != NULL) {
    // Linux and Android require names (with nul) fit in 16 chars, otherwise
    // pthread_setname_np() returns ERANGE (34).
    char thread_name[16];
    strncpy(thread_name, worker->thread_name, sizeof(thread_name) - 1);
    thread_name[sizeof(thread_name) - 1] = '\0';
    pthread_setname_np(pthread_self(), thread_name);
  }
#endif
  pthread_mutex_lock(&worker->impl_->mutex_);
  for (;;) {
    while (worker->status_ == AVX_WORKER_STATUS_OK) {  // wait in idling mode
      pthread_cond_wait(&worker->impl_->condition_, &worker->impl_->mutex_);
    }
    if (worker->status_ == AVX_WORKER_STATUS_WORKING) {
      // When worker->status_ is AVX_WORKER_STATUS_WORKING, the main thread
      // doesn't change worker->status_ and will wait until the worker changes
      // worker->status_ to AVX_WORKER_STATUS_OK. See change_state(). So the
      // worker can safely call execute() without holding worker->impl_->mutex_.
      // When the worker reacquires worker->impl_->mutex_, worker->status_ must
      // still be AVX_WORKER_STATUS_WORKING.
      pthread_mutex_unlock(&worker->impl_->mutex_);
      execute(worker);
      pthread_mutex_lock(&worker->impl_->mutex_);
      assert(worker->status_ == AVX_WORKER_STATUS_WORKING);
      worker->status_ = AVX_WORKER_STATUS_OK;
      // signal to the main thread that we're done (for sync())
      pthread_cond_signal(&worker->impl_->condition_);
    } else {
      assert(worker->status_ == AVX_WORKER_STATUS_NOT_OK);  // finish the worker
      break;
    }
  }
  pthread_mutex_unlock(&worker->impl_->mutex_);
  return THREAD_EXIT_SUCCESS;  // Thread is finished
}